

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.h
# Opt level: O0

AbstractTxOut * __thiscall
cfd::core::AbstractTxOut::operator=(AbstractTxOut *this,AbstractTxOut *param_1)

{
  AbstractTxOut *param_1_local;
  AbstractTxOut *this_local;
  
  (this->value_).amount_ = (param_1->value_).amount_;
  (this->value_).ignore_check_ = (param_1->value_).ignore_check_;
  Script::operator=(&this->locking_script_,&param_1->locking_script_);
  return this;
}

Assistant:

class CFD_CORE_EXPORT AbstractTxOut {
 public:
  /**
   * @brief constructor
   */
  AbstractTxOut();
  /**
   * @brief constructor
   * @param[in] value             amount value.
   * @param[in] locking_script    locking script.
   */
  AbstractTxOut(const Amount& value, const Script& locking_script);
  /**
   * @brief constructor
   * @param[in] locking_script    locking script.
   */
  explicit AbstractTxOut(const Script& locking_script);
  /**
   * @brief destructor
   */
  virtual ~AbstractTxOut() {
    // do nothing
  }
  /**
   * @brief Get the amount.
   * @return amount
   */
  const Amount GetValue() const;
  /**
   * @brief Get the locking script.
   * @return locking script
   */
  const Script GetLockingScript() const;
  /**
   * @brief get value amount.
   * @param[in] value    amount.
   */
  virtual void SetValue(const Amount& value);

 protected:
  Amount value_;           ///< amount
  Script locking_script_;  ///< locking script
}